

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_ringbuffer.c
# Opt level: O1

ring_buffer_size_t
PaUtil_GetRingBufferWriteRegions
          (PaUtilRingBuffer *rbuf,ring_buffer_size_t elementCount,void **dataPtr1,
          ring_buffer_size_t *sizePtr1,void **dataPtr2,ring_buffer_size_t *sizePtr2)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = rbuf->bufferSize;
  lVar1 = lVar2 - (rbuf->writeIndex - rbuf->readIndex & rbuf->bigMask);
  if (elementCount <= lVar1) {
    lVar1 = elementCount;
  }
  uVar3 = rbuf->smallMask & rbuf->writeIndex;
  if (lVar2 < (long)(uVar3 + lVar1)) {
    *dataPtr1 = rbuf->buffer + uVar3 * rbuf->elementSizeBytes;
    *sizePtr1 = lVar2 - uVar3;
    *dataPtr2 = rbuf->buffer;
    lVar2 = lVar1 - (lVar2 - uVar3);
  }
  else {
    *dataPtr1 = rbuf->buffer + uVar3 * rbuf->elementSizeBytes;
    *sizePtr1 = lVar1;
    *dataPtr2 = (void *)0x0;
    lVar2 = 0;
  }
  *sizePtr2 = lVar2;
  return lVar1;
}

Assistant:

ring_buffer_size_t PaUtil_GetRingBufferWriteRegions( PaUtilRingBuffer *rbuf, ring_buffer_size_t elementCount,
                                       void **dataPtr1, ring_buffer_size_t *sizePtr1,
                                       void **dataPtr2, ring_buffer_size_t *sizePtr2 )
{
    ring_buffer_size_t   index;
    ring_buffer_size_t   available = PaUtil_GetRingBufferWriteAvailable( rbuf );
    if( elementCount > available ) elementCount = available;
    /* Check to see if write is not contiguous. */
    index = rbuf->writeIndex & rbuf->smallMask;
    if( (index + elementCount) > rbuf->bufferSize )
    {
        /* Write data in two blocks that wrap the buffer. */
        ring_buffer_size_t   firstHalf = rbuf->bufferSize - index;
        *dataPtr1 = &rbuf->buffer[index*rbuf->elementSizeBytes];
        *sizePtr1 = firstHalf;
        *dataPtr2 = &rbuf->buffer[0];
        *sizePtr2 = elementCount - firstHalf;
    }
    else
    {
        *dataPtr1 = &rbuf->buffer[index*rbuf->elementSizeBytes];
        *sizePtr1 = elementCount;
        *dataPtr2 = NULL;
        *sizePtr2 = 0;
    }

    if( available )
        PaUtil_FullMemoryBarrier(); /* (write-after-read) => full barrier */

    return elementCount;
}